

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_lifetime_analyzer.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnLifetimeAnalyzer::ExtractUnusedColumnBindings
          (ColumnLifetimeAnalyzer *this,vector<duckdb::ColumnBinding,_true> *bindings,
          column_binding_set_t *unused_bindings)

{
  const_reference pvVar1;
  iterator iVar2;
  idx_t i;
  ulong __n;
  
  for (__n = 0; __n < (ulong)((long)(bindings->
                                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    ).
                                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(bindings->
                                    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    ).
                                    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1)
  {
    pvVar1 = vector<duckdb::ColumnBinding,_true>::get<true>(bindings,__n);
    iVar2 = ::std::
            _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->column_references)._M_h,pvVar1);
    if (iVar2.super__Node_iterator_base<duckdb::ColumnBinding,_true>._M_cur == (__node_type *)0x0) {
      pvVar1 = vector<duckdb::ColumnBinding,_true>::get<true>(bindings,__n);
      ::std::__detail::
      _Insert_base<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::insert((_Insert_base<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)unused_bindings,pvVar1);
    }
  }
  return;
}

Assistant:

void ColumnLifetimeAnalyzer::ExtractUnusedColumnBindings(const vector<ColumnBinding> &bindings,
                                                         column_binding_set_t &unused_bindings) {
	for (idx_t i = 0; i < bindings.size(); i++) {
		if (column_references.find(bindings[i]) == column_references.end()) {
			unused_bindings.insert(bindings[i]);
		}
	}
}